

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderLocals.cpp
# Opt level: O0

void __thiscall wasm::ReorderLocals::~ReorderLocals(ReorderLocals *this)

{
  ReorderLocals *this_local;
  
  ~ReorderLocals(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }